

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O2

bool __thiscall
glslang::TSymbolValidater::typeCheck
          (TSymbolValidater *this,TType *type1,TType *type2,string *name,bool isBlock)

{
  pointer pTVar1;
  pointer pTVar2;
  TType *type1_00;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *this_00;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *this_01;
  const_reference pvVar7;
  ulong uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_type __n;
  ulong __n_00;
  string errorStr;
  string newName;
  
  iVar5 = (*type1->_vptr_TType[0x25])(type1);
  if (((char)iVar5 == '\0') || (iVar5 = (*type2->_vptr_TType[0x25])(type2), (char)iVar5 == '\0')) {
    bVar4 = qualifierCheck(this,type1,type2,name,isBlock);
    return bVar4;
  }
  iVar5 = (*type1->_vptr_TType[7])(type1);
  if (iVar5 == 0x10) {
    iVar5 = (*type2->_vptr_TType[7])(type2);
    isBlock = iVar5 == 0x10 || isBlock;
  }
  this_00 = &TType::getStruct(type1)->
             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
  this_01 = &TType::getStruct(type2)->
             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
  std::__cxx11::string::string((string *)&newName,(string *)name);
  pTVar1 = (this_00->
           super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  pTVar2 = (this_00->
           super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
           _M_impl.super__Vector_impl_data._M_start;
  bVar4 = false;
  __n_00 = 0;
  for (__n = 0; __n != (long)pTVar1 - (long)pTVar2 >> 5; __n = __n + 1) {
    pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::at
                       (this_00,__n);
    iVar5 = (*pvVar7->type->_vptr_TType[7])();
    if (iVar5 != 0) {
      for (; uVar8 = (long)(this_01->
                           super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this_01->
                           super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 5, __n_00 < uVar8;
          __n_00 = __n_00 + 1) {
        pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::at
                           (this_01,__n_00);
        iVar5 = (*pvVar7->type->_vptr_TType[7])();
        if (iVar5 != 0) {
          uVar8 = (long)(this_01->
                        super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this_01->
                        super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 5;
          break;
        }
      }
      if (uVar8 == __n_00) {
        std::operator+(&errorStr,name,": struct mismatch.");
        TInfoSinkBase::message(&this->infoSink->info,EPrefixError,errorStr._M_dataplus._M_p);
        std::__cxx11::string::_M_dispose();
        bVar4 = true;
        break;
      }
      pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::at
                         (this_00,__n);
      iVar5 = (*pvVar7->type->_vptr_TType[6])();
      pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::at
                         (this_01,__n_00);
      iVar6 = (*pvVar7->type->_vptr_TType[6])();
      bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)CONCAT44(extraout_var,iVar5),
                              (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)CONCAT44(extraout_var_00,iVar6));
      if (bVar3) {
        std::operator+(&errorStr,name,": member name mismatch.");
        TInfoSinkBase::message(&this->infoSink->info,EPrefixError,errorStr._M_dataplus._M_p);
        std::__cxx11::string::_M_dispose();
      }
      else {
        pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::at
                           (this_00,__n);
        (*pvVar7->type->_vptr_TType[6])();
        std::__cxx11::string::assign((char *)&newName);
        if (bVar4 == false) {
          pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::at
                             (this_00,__n);
          type1_00 = pvVar7->type;
          pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::at
                             (this_01,__n_00);
          bVar4 = typeCheck(this,type1_00,pvVar7->type,&newName,isBlock);
          goto LAB_003779c0;
        }
      }
      bVar4 = true;
    }
LAB_003779c0:
    __n_00 = __n_00 + 1;
  }
  do {
    if ((ulong)((long)(this_01->
                      super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(this_01->
                      super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5) <= __n_00) goto LAB_00377a9a;
    pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::at
                       (this_01,__n_00);
    iVar5 = (*pvVar7->type->_vptr_TType[7])();
    __n_00 = __n_00 + 1;
  } while (iVar5 == 0);
  std::operator+(&errorStr,name,": struct mismatch.");
  TInfoSinkBase::message(&this->infoSink->info,EPrefixError,errorStr._M_dataplus._M_p);
  std::__cxx11::string::_M_dispose();
  bVar4 = true;
LAB_00377a9a:
  std::__cxx11::string::_M_dispose();
  return bVar4;
}

Assistant:

bool typeCheck(const TType* const type1, const TType* const type2, const std::string& name, bool isBlock)
    {
        bool hasError = false;
        if (!(type1->isStruct() && type2->isStruct())) {
            hasError = hasError || qualifierCheck(type1, type2, name, isBlock);
        }
        else {
            if (type1->getBasicType() == EbtBlock && type2->getBasicType() == EbtBlock)
                isBlock = true;
            const TTypeList* typeList1 = type1->getStruct();
            const TTypeList* typeList2 = type2->getStruct();

            std::string newName = name;
            size_t memberCount = typeList1->size();
            size_t index2 = 0;
            for (size_t index = 0; index < memberCount; index++, index2++) {
                // Skip inactive member
                if (typeList1->at(index).type->getBasicType() == EbtVoid)
                    continue;
                while (index2 < typeList2->size() && typeList2->at(index2).type->getBasicType() == EbtVoid) {
                    ++index2;
                }

                // TypeList1 has more members in list
                if (index2 == typeList2->size()) {
                    std::string errorStr = name + ": struct mismatch.";
                    infoSink.info.message(EPrefixError, errorStr.c_str());
                    hasError = true;
                    break;
                }

                if (typeList1->at(index).type->getFieldName() != typeList2->at(index2).type->getFieldName()) {
                    std::string errorStr = name + ": member name mismatch.";
                    infoSink.info.message(EPrefixError, errorStr.c_str());
                    hasError = true;
                }
                else {
                    newName = typeList1->at(index).type->getFieldName().c_str();
                }
                hasError = hasError || typeCheck(typeList1->at(index).type, typeList2->at(index2).type, newName, isBlock);
            }

            while (index2 < typeList2->size())
            {
                // TypeList2 has more members
                if (typeList2->at(index2).type->getBasicType() != EbtVoid) {
                    std::string errorStr = name + ": struct mismatch.";
                    infoSink.info.message(EPrefixError, errorStr.c_str());
                    hasError = true;
                    break;
                }
                ++index2;
            }
        }
        return hasError;
    }